

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incppect.cpp
# Opt level: O2

void __thiscall Incppect<true>::Impl::update(Impl *this)

{
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> bVar1;
  _Rb_tree_color _Var2;
  pointer pfVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  mapped_type *ppPVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  _Base_ptr p_Var10;
  ssize_t sVar11;
  _Rb_tree_node_base *p_Var12;
  int iVar13;
  _Base_ptr *pp_Var14;
  size_t __n;
  int i;
  uint uVar15;
  _Rb_tree_node_base *__k;
  int i_1;
  size_type __new_size;
  WebSocket<true,_true> *this_00;
  long lVar16;
  ulong uVar17;
  _Rb_tree_node_base *p_Var18;
  map<int,_Incppect<true>::Impl::PerSocketData_*,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::PerSocketData_*>_>_>
  *this_01;
  undefined1 auVar19 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar20;
  char v;
  char acStack_93 [3];
  int dataSize_bytes;
  int32_t type;
  uint32_t n;
  uint32_t c;
  uint32_t b;
  uint32_t typeAll;
  _Base_ptr *local_78;
  _Rb_tree_node_base *local_70;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> local_68;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> local_60;
  _Rb_tree_node_base *local_58;
  map<int,_Incppect<true>::Impl::PerSocketData_*,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::PerSocketData_*>_>_>
  *local_50;
  _Rb_tree_node_base *local_48;
  Impl *local_40;
  _Rb_tree_node_base *local_38;
  
  p_Var18 = &(this->clientData)._M_t._M_impl.super__Rb_tree_header._M_header;
  this_01 = &this->socketData;
  local_50 = this_01;
  local_48 = p_Var18;
  local_40 = this;
  for (p_Var12 = (this->clientData)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var12 != p_Var18; p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
    __k = p_Var12 + 1;
    ppPVar7 = std::
              map<int,_Incppect<true>::Impl::PerSocketData_*,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::PerSocketData_*>_>_>
              ::operator[](this_01,(key_type *)__k);
    iVar5 = uWS::AsyncSocket<true>::getBufferedAmount((AsyncSocket<true> *)(*ppPVar7)->ws);
    if (iVar5 == 0) {
      if (p_Var12[4]._M_parent != *(_Base_ptr *)(p_Var12 + 4)) {
        p_Var12[4]._M_parent = *(_Base_ptr *)(p_Var12 + 4);
      }
      local_68.container = (vector<char,_std::allocator<char>_> *)(p_Var12 + 4);
      local_78 = &p_Var12[4]._M_right;
      local_60.container = (vector<char,_std::allocator<char>_> *)&p_Var12[5]._M_left;
      typeAll = 0;
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((char *)&typeAll,(char *)&local_78,local_68);
      local_38 = (_Rb_tree_node_base *)&p_Var12[2]._M_right;
      local_70 = p_Var12;
      local_58 = __k;
      for (p_Var10 = p_Var12[3]._M_parent; p_Var18 = local_48, this_01 = local_50,
          p_Var10 != local_38; p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
        _Var2 = p_Var10[3]._M_color;
        pfVar3 = (this->getters).
                 super__Vector_base<std::function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>,_std::allocator<std::function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var8 = (_Base_ptr)anon_unknown.dwarf_63c84::timestamp();
        lVar16 = *(long *)(p_Var10 + 2);
        if (((long)p_Var8 - (long)p_Var10[1]._M_left < lVar16 ||
             0 < (long)p_Var10[1]._M_left && lVar16 < 0) &&
           ((long)p_Var10[1]._M_right < (long)p_Var8 - (long)p_Var10[1]._M_parent)) {
          if (lVar16 < 0) {
            p_Var10[1]._M_left = (_Base_ptr)0x0;
          }
          bVar20 = std::
                   function<std::basic_string_view<char,_std::char_traits<char>_>_(const_std::vector<int,_std::allocator<int>_>_&)>
                   ::operator()(pfVar3 + (int)_Var2,
                                (vector<int,_std::allocator<int>_> *)&p_Var10[2]._M_parent);
          bVar1.container = local_68.container;
          *(basic_string_view<char,_std::char_traits<char>_> *)&p_Var10[4]._M_right = bVar20;
          p_Var10[1]._M_parent = p_Var8;
          dataSize_bytes = (int)bVar20._M_len;
          iVar13 = dataSize_bytes % 4;
          iVar5 = dataSize_bytes + 1;
          for (lVar16 = 0; uVar6 = (uint)lVar16, iVar13 + -1 + uVar6 < 3; lVar16 = lVar16 + 1) {
            dataSize_bytes = iVar5 + uVar6;
          }
          type = 0;
          if ((0x100 < bVar20._M_len) &&
             ((long)p_Var10[3]._M_parent + ((bVar20._M_len + lVar16) - (long)p_Var10[3]._M_left) ==
              0)) {
            type = 1;
          }
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    ((char *)(p_Var10 + 1),&p_Var10[1].field_0x4,local_68);
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    ((char *)&type,(char *)&n,bVar1);
          bVar1.container = local_68.container;
          if (type == 1) {
            _v = 0;
            b = 0;
            c = 0;
            n = 0;
            if (p_Var10[4]._M_parent != *(_Base_ptr *)(p_Var10 + 4)) {
              p_Var10[4]._M_parent = *(_Base_ptr *)(p_Var10 + 4);
            }
            bVar1.container = (vector<char,_std::allocator<char>_> *)(p_Var10 + 4);
            uVar6 = 0;
            lVar16 = 0;
            while( true ) {
              uVar4 = n;
              uVar15 = (uint)p_Var10[4]._M_right;
              if ((int)uVar15 <= lVar16) break;
              b = *(uint *)(*(long *)(p_Var10 + 5) + lVar16);
              _v = *(uint *)((long)&(p_Var10[3]._M_parent)->_M_color + lVar16) ^ b;
              if (_v == uVar6) {
                n = n + 1;
              }
              else {
                if (n != 0) {
                  std::__copy_move<false,false,std::random_access_iterator_tag>::
                  __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                            ((char *)&n,(char *)&c,bVar1);
                  std::__copy_move<false,false,std::random_access_iterator_tag>::
                  __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                            ((char *)&c,(char *)&b,bVar1);
                }
                n = 1;
                c = _v;
                uVar6 = _v;
              }
              lVar16 = lVar16 + 4;
            }
            uVar9 = (ulong)p_Var10[4]._M_right & 3;
            if (uVar9 != 0) {
              _v = 0;
              b = 0;
              uVar17 = (ulong)(uVar15 & 0xfffffffc);
              memcpy(&v,(void *)((long)&(p_Var10[3]._M_parent)->_M_color + uVar17),uVar9);
              memcpy(&b,(void *)(uVar17 + *(long *)(p_Var10 + 5)),uVar9);
              _v = b ^ _v;
              if (_v == uVar6) {
                n = uVar4 + 1;
              }
              else {
                std::__copy_move<false,false,std::random_access_iterator_tag>::
                __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                          ((char *)&n,(char *)&c,bVar1);
                std::__copy_move<false,false,std::random_access_iterator_tag>::
                __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                          ((char *)&c,(char *)&b,bVar1);
                n = 1;
                c = _v;
              }
            }
            p_Var12 = local_70;
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                      ((char *)&n,(char *)&c,bVar1);
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                      ((char *)&c,(char *)&b,bVar1);
            bVar1.container = local_68.container;
            dataSize_bytes = *(int *)&p_Var10[4]._M_parent - p_Var10[4]._M_color;
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                      ((char *)&dataSize_bytes,(char *)&type,local_68);
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                      (*(char **)(p_Var10 + 4),(char *)p_Var10[4]._M_parent,bVar1);
            this = local_40;
          }
          else if (type == 0) {
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                      ((char *)&dataSize_bytes,(char *)&type,local_68);
            std::__copy_move<false,false,std::random_access_iterator_tag>::
            __copy_m<char_const*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                      (*(char **)(p_Var10 + 5),
                       *(char **)(p_Var10 + 5) + (long)&(p_Var10[4]._M_right)->_M_color,bVar1);
            _v = _v & 0xffffff00;
            for (uVar15 = 0; uVar15 < uVar6; uVar15 = uVar15 + 1) {
              std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                        (&v,acStack_93,local_68);
            }
          }
          std::vector<char,_std::allocator<char>_>::resize
                    ((vector<char,_std::allocator<char>_> *)&p_Var10[3]._M_parent,
                     (size_type)p_Var10[4]._M_right);
          __k = local_58;
          if (p_Var10[4]._M_right != (_Base_ptr)0x0) {
            memmove(p_Var10[3]._M_parent,*(void **)(p_Var10 + 5),(size_t)p_Var10[4]._M_right);
          }
        }
      }
      uVar9 = (long)p_Var12[4]._M_parent - *(long *)(p_Var12 + 4);
      if (4 < uVar9) {
        if ((uVar9 < 0x101) || (uVar9 != *(long *)(p_Var12 + 5) - (long)p_Var12[4]._M_right)) {
          if ((this->parameters).maxPayloadLength_bytes < (int)uVar9) {
            printf("[incppect] warning: buffer size (%d) exceeds maxPayloadLength (%d)\n");
            uVar9 = (long)p_Var12[4]._M_parent - *(long *)(p_Var12 + 4);
          }
          ppPVar7 = std::
                    map<int,_Incppect<true>::Impl::PerSocketData_*,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::PerSocketData_*>_>_>
                    ::operator[](this_01,(key_type *)__k);
          this_00 = (*ppPVar7)->ws;
          p_Var10 = *(_Base_ptr *)(p_Var12 + 4);
          iVar5 = (int)p_Var12[4]._M_parent;
        }
        else {
          dataSize_bytes = 0;
          type = 0;
          if (p_Var12[5]._M_right != p_Var12[5]._M_left) {
            p_Var12[5]._M_right = p_Var12[5]._M_left;
          }
          _v = 1;
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    (&v,(char *)&dataSize_bytes,local_60);
          pp_Var14 = local_78;
          for (lVar16 = 4; bVar1.container = local_60.container,
              lVar16 < *(int *)&p_Var12[4]._M_parent - (int)*(long *)(p_Var12 + 4);
              lVar16 = lVar16 + 4) {
            uVar6 = *(uint *)(*(long *)(p_Var12 + 4) + lVar16) ^
                    *(uint *)((long)&(*pp_Var14)->_M_color + lVar16);
            if (uVar6 == dataSize_bytes) {
              type = type + 1;
            }
            else {
              if (type != 0) {
                std::__copy_move<false,false,std::random_access_iterator_tag>::
                __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                          ((char *)&type,(char *)&n,local_60);
                std::__copy_move<false,false,std::random_access_iterator_tag>::
                __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                          ((char *)&dataSize_bytes,(char *)&type,bVar1);
                pp_Var14 = local_78;
              }
              type = 1;
              dataSize_bytes = uVar6;
            }
            p_Var12 = local_70;
          }
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    ((char *)&type,(char *)&n,local_60);
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                    ((char *)&dataSize_bytes,(char *)&type,bVar1);
          uVar9 = (long)p_Var12[5]._M_right - (long)p_Var12[5]._M_left;
          if ((this->parameters).maxPayloadLength_bytes < (int)uVar9) {
            printf("[incppect] warning: buffer size (%d) exceeds maxPayloadLength (%d)\n");
            uVar9 = (long)p_Var12[5]._M_right - (long)p_Var12[5]._M_left;
          }
          __k = local_58;
          ppPVar7 = std::
                    map<int,_Incppect<true>::Impl::PerSocketData_*,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::PerSocketData_*>_>_>
                    ::operator[](this_01,(key_type *)local_58);
          this_00 = (*ppPVar7)->ws;
          p_Var10 = p_Var12[5]._M_left;
          iVar5 = (int)p_Var12[5]._M_right;
        }
        sVar11 = uWS::WebSocket<true,_true>::send
                           (this_00,iVar5 - (int)p_Var10,p_Var10,2,(uint)(0x40 < uVar9));
        if ((char)sVar11 == '\0') {
          printf("[incpeect] warning: backpressure for client %d increased \n",(ulong)__k->_M_color)
          ;
        }
        __new_size = (long)p_Var12[4]._M_parent - *(long *)(p_Var12 + 4);
        auVar19._8_4_ = (int)(__new_size >> 0x20);
        auVar19._0_8_ = __new_size;
        auVar19._12_4_ = 0x45300000;
        this->txTotal_bytes =
             (auVar19._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)__new_size) - 4503599627370496.0) +
             this->txTotal_bytes;
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)local_78,__new_size);
        __n = (long)p_Var12[4]._M_parent - (long)*(void **)(p_Var12 + 4);
        if (__n != 0) {
          memmove(*local_78,*(void **)(p_Var12 + 4),__n);
        }
      }
    }
    else {
      ppPVar7 = std::
                map<int,_Incppect<true>::Impl::PerSocketData_*,_std::less<int>,_std::allocator<std::pair<const_int,_Incppect<true>::Impl::PerSocketData_*>_>_>
                ::operator[](this_01,(key_type *)__k);
      uVar6 = uWS::AsyncSocket<true>::getBufferedAmount((AsyncSocket<true> *)(*ppPVar7)->ws);
      printf("[incppect] warning: buffered amount = %d, not sending updates to client %d. waiting for buffer to drain\n"
             ,(ulong)uVar6,(ulong)__k->_M_color);
    }
  }
  return;
}

Assistant:

void update() {
        for (auto & [clientId, cd] : clientData) {
            if (socketData[clientId]->ws->getBufferedAmount()) {
                my_printf("[incppect] warning: buffered amount = %d, not sending updates to client %d. waiting for buffer to drain\n", socketData[clientId]->ws->getBufferedAmount(), clientId);
                continue;
            }

            auto & curBuffer = cd.curBuffer;
            auto & prevBuffer = cd.prevBuffer;
            auto & diffBuffer = cd.diffBuffer;

            curBuffer.clear();

            uint32_t typeAll = 0;
            std::copy((char *)(&typeAll), (char *)(&typeAll) + sizeof(typeAll), std::back_inserter(curBuffer));

            for (auto & [requestId, req] : cd.requests) {
                auto & getter = getters[req.getterId];
                auto tCur = ::timestamp();
                if (((req.tLastRequestTimeout_ms < 0 && req.tLastRequested_ms > 0) || (tCur - req.tLastRequested_ms < req.tLastRequestTimeout_ms)) &&
                    tCur - req.tLastUpdated_ms > req.tMinUpdate_ms) {
                    if (req.tLastRequestTimeout_ms < 0) {
                        req.tLastRequested_ms = 0;
                    }

                    req.curData = getter(req.idxs);
                    req.tLastUpdated_ms = tCur;

                    const int kPadding = 4;

                    int dataSize_bytes = req.curData.size();
                    int padding_bytes = 0;
                    {
                        int r = dataSize_bytes%kPadding;
                        while (r > 0 && r < kPadding) {
                            ++dataSize_bytes;
                            ++padding_bytes;
                            ++r;
                        }
                    }

                    int32_t type = 0; // full update
                    if (req.prevData.size() == req.curData.size() + padding_bytes && req.curData.size() > 256) {
                        type = 1; // run-length encoding of diff
                    }

                    std::copy((char *)(&requestId), (char *)(&requestId) + sizeof(requestId), std::back_inserter(curBuffer));
                    std::copy((char *)(&type), (char *)(&type) + sizeof(type), std::back_inserter(curBuffer));

                    if (type == 0) {
                        std::copy((char *)(&dataSize_bytes), (char *)(&dataSize_bytes) + sizeof(dataSize_bytes), std::back_inserter(curBuffer));
                        std::copy(req.curData.begin(), req.curData.end(), std::back_inserter(curBuffer));
                        {
                            char v = 0;
                            for (int i = 0; i < padding_bytes; ++i) {
                                std::copy((char *)(&v), (char *)(&v) + sizeof(v), std::back_inserter(curBuffer));
                            }
                        }
                    } else if (type == 1) {
                        uint32_t a = 0;
                        uint32_t b = 0;
                        uint32_t c = 0;
                        uint32_t n = 0;
                        req.diffData.clear();

                        for (int i = 0; i < (int) req.curData.size(); i += 4) {
                            std::memcpy((char *)(&a), req.prevData.data() + i, sizeof(uint32_t));
                            std::memcpy((char *)(&b), req.curData.data() + i, sizeof(uint32_t));
                            a = a ^ b;
                            if (a == c) {
                                ++n;
                            } else {
                                if (n > 0) {
                                    std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(req.diffData));
                                    std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(req.diffData));
                                }
                                n = 1;
                                c = a;
                            }
                        }

                        if (req.curData.size() % 4 != 0) {
                            a = 0;
                            b = 0;
                            uint32_t i = (req.curData.size()/4)*4;
                            uint32_t k = req.curData.size() - i;
                            std::memcpy((char *)(&a), req.prevData.data() + i, k);
                            std::memcpy((char *)(&b), req.curData.data() + i, k);
                            a = a ^ b;
                            if (a == c) {
                                ++n;
                            } else {
                                std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(req.diffData));
                                std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(req.diffData));
                                n = 1;
                                c = a;
                            }
                        }

                        std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(req.diffData));
                        std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(req.diffData));

                        dataSize_bytes = req.diffData.size();
                        std::copy((char *)(&dataSize_bytes), (char *)(&dataSize_bytes) + sizeof(dataSize_bytes), std::back_inserter(curBuffer));
                        std::copy(req.diffData.begin(), req.diffData.end(), std::back_inserter(curBuffer));
                    }

                    req.prevData.resize(req.curData.size());
                    std::copy(req.curData.begin(), req.curData.end(), req.prevData.begin());
                }
            }

            if (curBuffer.size() > 4) {
                if (curBuffer.size() == prevBuffer.size() && curBuffer.size() > 256) {
                    uint32_t a = 0;
                    uint32_t b = 0;
                    uint32_t c = 0;
                    uint32_t n = 0;
                    diffBuffer.clear();

                    uint32_t typeAll = 1;
                    std::copy((char *)(&typeAll), (char *)(&typeAll) + sizeof(typeAll), std::back_inserter(diffBuffer));

                    for (int i = 4; i < (int) curBuffer.size(); i += 4) {
                        std::memcpy((char *)(&a), prevBuffer.data() + i, sizeof(uint32_t));
                        std::memcpy((char *)(&b), curBuffer.data() + i, sizeof(uint32_t));
                        a = a ^ b;
                        if (a == c) {
                            ++n;
                        } else {
                            if (n > 0) {
                                std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(diffBuffer));
                                std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(diffBuffer));
                            }
                            n = 1;
                            c = a;
                        }
                    }

                    std::copy((char *)(&n), (char *)(&n) + sizeof(uint32_t), std::back_inserter(diffBuffer));
                    std::copy((char *)(&c), (char *)(&c) + sizeof(uint32_t), std::back_inserter(diffBuffer));

                    if ((int32_t) diffBuffer.size() > parameters.maxPayloadLength_bytes) {
                        my_printf("[incppect] warning: buffer size (%d) exceeds maxPayloadLength (%d)\n", (int) diffBuffer.size(), parameters.maxPayloadLength_bytes);
                    }

                    // compress only for message larger than 64 bytes
                    bool doCompress = diffBuffer.size() > 64;

                    if (socketData[clientId]->ws->send({ diffBuffer.data(), diffBuffer.size() }, uWS::OpCode::BINARY, doCompress) == false) {
                        my_printf("[incpeect] warning: backpressure for client %d increased \n", clientId);
                    }
                } else {
                    if ((int32_t) curBuffer.size() > parameters.maxPayloadLength_bytes) {
                        my_printf("[incppect] warning: buffer size (%d) exceeds maxPayloadLength (%d)\n", (int) curBuffer.size(), parameters.maxPayloadLength_bytes);
                    }

                    // compress only for message larger than 64 bytes
                    bool doCompress = curBuffer.size() > 64;

                    if (socketData[clientId]->ws->send({ curBuffer.data(), curBuffer.size() }, uWS::OpCode::BINARY, doCompress) == false) {
                        my_printf("[incpeect] warning: backpressure for client %d increased \n", clientId);
                    }
                }

                txTotal_bytes += curBuffer.size();

                prevBuffer.resize(curBuffer.size());
                std::copy(curBuffer.begin(), curBuffer.end(), prevBuffer.begin());
            }
        }
    }